

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int heap_add_entry(archive_read *a,heap_queue *heap,file_info *file,uint64_t key)

{
  file_info **__src;
  uint uVar1;
  int iVar2;
  file_info **ppfVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (ulong)(uint)heap->used;
  iVar2 = heap->allocated;
  if (heap->used < iVar2) {
LAB_00128538:
    file->key = key;
    heap->used = (int)uVar5 + 1;
    if (0 < (int)uVar5) {
      do {
        uVar1 = (int)uVar5 - 1;
        uVar6 = (ulong)(uVar1 >> 1);
        ppfVar3 = heap->files;
        if (ppfVar3[uVar6]->key <= key) {
          ppfVar3[uVar5] = file;
          goto LAB_0012858f;
        }
        ppfVar3[uVar5] = ppfVar3[uVar6];
        uVar5 = uVar6;
      } while (1 < uVar1);
    }
    *heap->files = file;
LAB_0012858f:
    iVar2 = 0;
  }
  else {
    iVar4 = iVar2 * 2;
    if (iVar2 < 0x400) {
      iVar4 = 0x400;
    }
    if (iVar2 < iVar4) {
      ppfVar3 = (file_info **)malloc((long)iVar4 << 3);
      if (ppfVar3 != (file_info **)0x0) {
        __src = heap->files;
        memcpy(ppfVar3,__src,(long)iVar2 << 3);
        if (__src != (file_info **)0x0) {
          free(__src);
          uVar5 = (ulong)(uint)heap->used;
        }
        heap->files = ppfVar3;
        heap->allocated = iVar4;
        goto LAB_00128538;
      }
    }
    archive_set_error(&a->archive,0xc,"Out of memory");
    iVar2 = -0x1e;
  }
  return iVar2;
}

Assistant:

static int
heap_add_entry(struct archive_read *a, struct heap_queue *heap,
    struct file_info *file, uint64_t key)
{
	uint64_t file_key, parent_key;
	int hole, parent;

	/* Expand our pending files list as necessary. */
	if (heap->used >= heap->allocated) {
		struct file_info **new_pending_files;
		int new_size = heap->allocated * 2;

		if (heap->allocated < 1024)
			new_size = 1024;
		/* Overflow might keep us from growing the list. */
		if (new_size <= heap->allocated) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		new_pending_files = (struct file_info **)
		    malloc(new_size * sizeof(new_pending_files[0]));
		if (new_pending_files == NULL) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(new_pending_files, heap->files,
		    heap->allocated * sizeof(new_pending_files[0]));
		if (heap->files != NULL)
			free(heap->files);
		heap->files = new_pending_files;
		heap->allocated = new_size;
	}

	file_key = file->key = key;

	/*
	 * Start with hole at end, walk it up tree to find insertion point.
	 */
	hole = heap->used++;
	while (hole > 0) {
		parent = (hole - 1)/2;
		parent_key = heap->files[parent]->key;
		if (file_key >= parent_key) {
			heap->files[hole] = file;
			return (ARCHIVE_OK);
		}
		/* Move parent into hole <==> move hole up tree. */
		heap->files[hole] = heap->files[parent];
		hole = parent;
	}
	heap->files[0] = file;

	return (ARCHIVE_OK);
}